

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuadList.h
# Opt level: O0

int __thiscall QuadList<SSTableDataEntry>::init(QuadList<SSTableDataEntry> *this,EVP_PKEY_CTX *ctx)

{
  NodePosi pQVar1;
  QuadListNode<SSTableDataEntry> *pQVar2;
  SSTableDataEntry local_a8;
  undefined1 local_65;
  SSTableDataEntry local_58;
  QuadList<SSTableDataEntry> *local_10;
  QuadList<SSTableDataEntry> *this_local;
  
  local_10 = this;
  pQVar2 = (QuadListNode<SSTableDataEntry> *)operator_new(0x60);
  local_65 = 1;
  local_58.value.field_2._M_allocated_capacity = 0;
  local_58.value.field_2._8_8_ = 0;
  local_58.value._M_dataplus = (_Alloc_hider)0x0;
  local_58.value._1_7_ = 0;
  local_58.value._M_string_length = 0;
  local_58.key = 0;
  local_58.value_length = 0;
  local_58.delete_flag = false;
  local_58._1_7_ = 0;
  local_58.timestamp = 0;
  SSTableDataEntry::SSTableDataEntry(&local_58);
  QuadListNode<SSTableDataEntry>::QuadListNode
            (pQVar2,&local_58,(QuadListNode<SSTableDataEntry> *)0x0,
             (QuadListNode<SSTableDataEntry> *)0x0,(QuadListNode<SSTableDataEntry> *)0x0,
             (QuadListNode<SSTableDataEntry> *)0x0);
  local_65 = 0;
  this->header = pQVar2;
  SSTableDataEntry::~SSTableDataEntry(&local_58);
  pQVar2 = (QuadListNode<SSTableDataEntry> *)operator_new(0x60);
  local_a8.value.field_2._M_allocated_capacity = 0;
  local_a8.value.field_2._8_8_ = 0;
  local_a8.value._M_dataplus = (_Alloc_hider)0x0;
  local_a8.value._1_7_ = 0;
  local_a8.value._M_string_length = 0;
  local_a8.key = 0;
  local_a8.value_length = 0;
  local_a8.delete_flag = false;
  local_a8._1_7_ = 0;
  local_a8.timestamp = 0;
  SSTableDataEntry::SSTableDataEntry(&local_a8);
  QuadListNode<SSTableDataEntry>::QuadListNode
            (pQVar2,&local_a8,(QuadListNode<SSTableDataEntry> *)0x0,
             (QuadListNode<SSTableDataEntry> *)0x0,(QuadListNode<SSTableDataEntry> *)0x0,
             (QuadListNode<SSTableDataEntry> *)0x0);
  this->trailer = pQVar2;
  SSTableDataEntry::~SSTableDataEntry(&local_a8);
  this->header->succ = this->trailer;
  pQVar1 = this->trailer;
  pQVar1->pred = this->header;
  return (int)pQVar1;
}

Assistant:

void QuadList<T>::init() {
    header = new Node();
    trailer = new Node();
    header->succ = trailer;
    trailer->pred = header;
}